

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font_to_svg.hpp
# Opt level: O1

string * __thiscall font2svg::glyph::points_abi_cxx11_(string *__return_storage_ptr__,glyph *this)

{
  byte bVar1;
  FT_Vector *pFVar2;
  FT_Pos FVar3;
  FT_Pos FVar4;
  string *psVar5;
  glyph *pgVar6;
  ostream *poVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  undefined1 *puVar12;
  string color;
  char *local_78;
  long local_70;
  char local_68;
  undefined7 uStack_67;
  glyph *local_58;
  int local_50;
  int local_4c;
  undefined1 *local_48;
  string *local_40;
  ulong local_38;
  
  local_78 = &local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
  puVar12 = &this->field_0x278;
  local_58 = this;
  std::__cxx11::stringbuf::str((string *)puVar12);
  local_48 = puVar12;
  local_40 = __return_storage_ptr__;
  if (local_78 != &local_68) {
    operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
  }
  pgVar6 = local_58;
  puVar12 = &local_58->field_0x270;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)puVar12,"\n\n  <!-- draw points as circles -->",0x23);
  uVar8 = (uint)(pgVar6->ftoutline).n_points;
  uVar9 = (ulong)uVar8;
  if (0 < (int)uVar8) {
    lVar11 = 0;
    uVar10 = 0;
    do {
      pFVar2 = pgVar6->ftpoints;
      local_38 = uVar10 + 1;
      uVar9 = (long)((ulong)(uint)((int)local_38 >> 0x1f) << 0x20 | local_38 & 0xffffffff) %
              (long)(int)uVar9 & 0xffffffff;
      bVar1 = pgVar6->tags[uVar9];
      local_4c = *(int *)((long)&pFVar2->x + lVar11);
      local_50 = *(int *)((long)&pFVar2->y + lVar11);
      FVar3 = pFVar2[uVar9].x;
      FVar4 = pFVar2[uVar9].y;
      local_78 = &local_68;
      local_70 = 0;
      local_68 = '\0';
      if ((pgVar6->tags[uVar10] & 1U) == 0) {
        std::__cxx11::string::_M_replace((ulong)&local_78,0,(char *)0x0,0x10767c);
        if ((bVar1 & 1) == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)puVar12,"\n  <!-- halfway pt between 2 ctrl pts -->",0x29);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar12,"<circle",7);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar12," fill=\'",7);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar12,"blue",4);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar12,"\'",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)puVar12," stroke=\'black\'",0xf);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar12," cx=\'",5);
          poVar7 = (ostream *)
                   std::ostream::operator<<((ostream *)puVar12,((int)FVar3 + local_4c) / 2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\' cy=\'",6);
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,((int)FVar4 + local_50) / 2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\'",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," r=\'",4);
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\'",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"/>",2);
        }
      }
      else {
        std::__cxx11::string::_M_replace((ulong)&local_78,0,(char *)0x0,0x107681);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar12,"\n  <!--",7);
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)puVar12,(int)uVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"-->",3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar12,"<circle",7);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar12," fill=\'",7);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)puVar12,local_78,local_70);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\'",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," stroke=\'black\'",0xf);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," cx=\'",5);
      poVar7 = std::ostream::_M_insert<long>((long)poVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\' cy=\'",6);
      poVar7 = std::ostream::_M_insert<long>((long)poVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\'",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," r=\'",4);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,(uint)(uVar10 == 0) * 5 + 5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\'",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"/>",2);
      if (local_78 != &local_68) {
        operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
      }
      uVar9 = (ulong)(local_58->ftoutline).n_points;
      lVar11 = lVar11 + 0x10;
      pgVar6 = local_58;
      uVar10 = local_38;
    } while ((long)local_38 < (long)uVar9);
  }
  psVar5 = local_40;
  std::__cxx11::stringbuf::str();
  return psVar5;
}

Assistant:

std::string points()  {
		tmp.str("");
		tmp << "\n\n  <!-- draw points as circles -->";
		for ( int i = 0 ; i < ftoutline.n_points ; i++ ) {
			bool this_is_ctrl_pt = !(tags[i] & 1);
			bool next_is_ctrl_pt = !(tags[(i+1)%ftoutline.n_points] & 1);
			int x = ftpoints[i].x;
			int y = ftpoints[i].y;
			int nx = ftpoints[(i+1)%ftoutline.n_points].x;
			int ny = ftpoints[(i+1)%ftoutline.n_points].y;
			int radius = 5;
			if ( i == 0 ) radius = 10;
			std::string color;
			if (this_is_ctrl_pt) color = "none"; else color = "blue";
			if (this_is_ctrl_pt && next_is_ctrl_pt) {
				tmp << "\n  <!-- halfway pt between 2 ctrl pts -->";
				tmp << "<circle"
				  << " fill='" << "blue" << "'"
				  << " stroke='black'"
				  << " cx='" << (x+nx)/2 << "' cy='" << (y+ny)/2 << "'"
				  << " r='" << 2 << "'"
				  << "/>";
			};
			tmp << "\n  <!--" << i << "-->";
			tmp << "<circle"
				<< " fill='" << color << "'"
				<< " stroke='black'"
				<< " cx='" << ftpoints[i].x << "' cy='" << ftpoints[i].y << "'"
				<< " r='" << radius << "'"
				<< "/>";
		}

		return tmp.str();
	}